

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::NonPackedInt32::ByteSizeLong(NonPackedInt32 *this)

{
  bool bVar1;
  int iVar2;
  RepeatedField<int> *value;
  size_t sVar3;
  long lVar4;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  NonPackedInt32 *this_;
  NonPackedInt32 *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_repeated_int32(this);
  sStack_58 = google::protobuf::internal::WireFormatLite::Int32Size(value);
  iVar2 = _internal_repeated_int32_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_58 = sVar3 * 3 + sStack_58;
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    sStack_58 = lVar4 + sStack_58;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar2);
  return sStack_58;
}

Assistant:

::size_t NonPackedInt32::ByteSizeLong() const {
  const NonPackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.NonPackedInt32)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 2048;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{3} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}